

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DTDScanner::scanDefaultDecl(DTDScanner *this,DTDAttDef *toFill)

{
  XMLBufferMgr *this_00;
  XMLCh *newValue;
  bool bVar1;
  int iVar2;
  XMLBuffer *toFill_00;
  undefined4 extraout_var;
  DefAttTypes DVar3;
  XMLBufBid bbValue;
  
  bVar1 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgRequiredString);
  if (bVar1) {
    (toFill->super_XMLAttDef).fDefaultType = Required;
  }
  else {
    bVar1 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgImpliedString);
    if (bVar1) {
      (toFill->super_XMLAttDef).fDefaultType = Implied;
    }
    else {
      bVar1 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgFixedString);
      DVar3 = DefAttTypes_Min;
      if (bVar1) {
        DVar3 = Fixed;
        bVar1 = ReaderMgr::skippedSpace(this->fReaderMgr);
        if (bVar1) {
          ReaderMgr::skipPastSpaces(this->fReaderMgr);
        }
        else {
          XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
        }
      }
      (toFill->super_XMLAttDef).fDefaultType = DVar3;
      checkForPERef(this,false,true);
      this_00 = this->fBufMgr;
      toFill_00 = XMLBufferMgr::bidOnBuffer(this_00);
      bbValue.fBuffer = toFill_00;
      bbValue.fMgr = this_00;
      iVar2 = (*(toFill->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])(toFill);
      bVar1 = scanAttValue(this,(XMLCh *)CONCAT44(extraout_var,iVar2),toFill_00,
                           (toFill->super_XMLAttDef).fType);
      if (!bVar1) {
        XMLScanner::emitError(this->fScanner,ExpectedDefAttrDecl);
      }
      newValue = (bbValue.fBuffer)->fBuffer;
      newValue[(bbValue.fBuffer)->fIndex] = L'\0';
      XMLAttDef::setValue(&toFill->super_XMLAttDef,newValue);
      XMLBufBid::~XMLBufBid(&bbValue);
    }
  }
  return;
}

Assistant:

void DTDScanner::scanDefaultDecl(DTDAttDef& toFill)
{
    if (fReaderMgr->skippedString(XMLUni::fgRequiredString))
    {
        toFill.setDefaultType(XMLAttDef::Required);
        return;
    }

    if (fReaderMgr->skippedString(XMLUni::fgImpliedString))
    {
        toFill.setDefaultType(XMLAttDef::Implied);
        return;
    }

    if (fReaderMgr->skippedString(XMLUni::fgFixedString))
    {
        //
        //  There must be space before the fixed value. If there is not, then
        //  emit an error but keep going.
        //
        if (!fReaderMgr->skippedSpace())
            fScanner->emitError(XMLErrs::ExpectedWhitespace);
        else
            fReaderMgr->skipPastSpaces();
        toFill.setDefaultType(XMLAttDef::Fixed);
    }
     else
    {
        toFill.setDefaultType(XMLAttDef::Default);
    }

    //
    //  If we got here, its fixed or default, so we need to get a value.
    //  If we don't, then emit an error but just set the default value to
    //  an empty string and try to keep going.
    //
    // Check for PE ref or optional whitespace
    checkForPERef(false, true);

    XMLBufBid bbValue(fBufMgr);
    if (!scanAttValue(toFill.getFullName(), bbValue.getBuffer(), toFill.getType()))
        fScanner->emitError(XMLErrs::ExpectedDefAttrDecl);

    toFill.setValue(bbValue.getRawBuffer());
}